

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

int fmt::v7::detail::add_compare(bigint *lhs1,bigint *lhs2,bigint *rhs)

{
  bigit bVar1;
  bigit bVar2;
  bigit bVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  anon_class_1_0_00000001 local_31 [8];
  anon_class_1_0_00000001 get_bigit;
  
  iVar8 = lhs1->exp_;
  iVar6 = (int)(lhs1->bigits_).super_buffer<unsigned_int>.size_ + iVar8;
  iVar10 = lhs2->exp_;
  iVar9 = (int)(lhs2->bigits_).super_buffer<unsigned_int>.size_ + iVar10;
  if (iVar9 < iVar6) {
    iVar9 = iVar6;
  }
  iVar6 = rhs->exp_;
  iVar7 = (int)(rhs->bigits_).super_buffer<unsigned_int>.size_ + iVar6;
  if (iVar9 + 1 < iVar7) {
    iVar9 = -1;
  }
  else if (iVar7 < iVar9) {
    iVar9 = 1;
  }
  else {
    if (iVar10 < iVar8) {
      iVar8 = iVar10;
    }
    if (iVar6 < iVar8) {
      iVar8 = iVar6;
    }
    uVar5 = 0;
    iVar10 = -1;
    while (uVar4 = uVar5, iVar8 < iVar7) {
      iVar9 = iVar7 + -1;
      bVar1 = add_compare::anon_class_1_0_00000001::operator()(local_31,lhs1,iVar9);
      bVar2 = add_compare::anon_class_1_0_00000001::operator()(local_31,lhs2,iVar9);
      bVar3 = add_compare::anon_class_1_0_00000001::operator()(local_31,rhs,iVar9);
      uVar4 = (bVar3 | uVar5) - ((ulong)bVar2 + (ulong)bVar1);
      if ((bVar3 | uVar5) < (ulong)bVar2 + (ulong)bVar1) {
        iVar10 = 1;
        uVar4 = uVar5;
        break;
      }
      if (1 < uVar4) break;
      uVar5 = uVar4 << 0x20;
      iVar7 = iVar9;
    }
    iVar9 = -(uint)(uVar4 != 0);
    if (iVar8 < iVar7) {
      iVar9 = iVar10;
    }
  }
  return iVar9;
}

Assistant:

int add_compare(const bigint& lhs1, const bigint& lhs2,
                         const bigint& rhs) {
    int max_lhs_bigits = (std::max)(lhs1.num_bigits(), lhs2.num_bigits());
    int num_rhs_bigits = rhs.num_bigits();
    if (max_lhs_bigits + 1 < num_rhs_bigits) return -1;
    if (max_lhs_bigits > num_rhs_bigits) return 1;
    auto get_bigit = [](const bigint& n, int i) -> bigit {
      return i >= n.exp_ && i < n.num_bigits() ? n[i - n.exp_] : 0;
    };
    double_bigit borrow = 0;
    int min_exp = (std::min)((std::min)(lhs1.exp_, lhs2.exp_), rhs.exp_);
    for (int i = num_rhs_bigits - 1; i >= min_exp; --i) {
      double_bigit sum =
          static_cast<double_bigit>(get_bigit(lhs1, i)) + get_bigit(lhs2, i);
      bigit rhs_bigit = get_bigit(rhs, i);
      if (sum > rhs_bigit + borrow) return 1;
      borrow = rhs_bigit + borrow - sum;
      if (borrow > 1) return -1;
      borrow <<= bigit_bits;
    }
    return borrow != 0 ? -1 : 0;
  }